

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O0

void __thiscall BigInt::BigInt(BigInt *this,int length,int init_value,bool positive_sign)

{
  value_type vVar1;
  int iVar2;
  runtime_error *this_00;
  reference pvVar3;
  allocator<int> local_49;
  vector<int,_std::allocator<int>_> local_48;
  byte local_19;
  int local_18;
  int iStack_14;
  bool positive_sign_local;
  int init_value_local;
  int length_local;
  BigInt *this_local;
  
  local_19 = positive_sign;
  local_18 = init_value;
  iStack_14 = length;
  _init_value_local = this;
  std::vector<int,_std::allocator<int>_>::vector(&this->value);
  if ((0 < local_18) && (local_18 < 10)) {
    this->sign = (byte)~local_19 & 1;
    iVar2 = iStack_14 + 1;
    std::allocator<int>::allocator(&local_49);
    std::vector<int,_std::allocator<int>_>::vector(&local_48,(long)iVar2,&local_18,&local_49);
    std::vector<int,_std::allocator<int>_>::operator=(&this->value,&local_48);
    std::vector<int,_std::allocator<int>_>::~vector(&local_48);
    std::allocator<int>::~allocator(&local_49);
    vVar1 = this->sign;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->value,0);
    *pvVar3 = vVar1;
    this->real_length = iStack_14;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"ERROR init value must > 0 and < 10!");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

BigInt::BigInt(int length, int init_value, bool positive_sign) {
    if (init_value <= 0 || init_value > 9) {
        throw runtime_error("ERROR init value must > 0 and < 10!");
    }
    this->sign = positive_sign ? 0 : 1;
    this->value = vector<int>(length + 1, init_value);
    this->value[0] = this->sign;
    this->real_length = length;
}